

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
LoadSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ReadBinaryFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,filename);
  if (*(int *)local_28._M_impl.super__Vector_impl_data._M_start == 0xe000e) {
    anon_unknown.dwarf_7455::LoadCgaSpritesheet
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28);
  }
  else if (*(int *)local_28._M_impl.super__Vector_impl_data._M_start == 0xe001d) {
    anon_unknown.dwarf_7455::LoadEgaSpritesheet
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  if (memcmp(data.data(), cga_header.data(), cga_header.size()) == 0) {
    return LoadCgaSpritesheet(data);
  }
  if (memcmp(data.data(), ega_header.data(), ega_header.size()) == 0) {
    return LoadEgaSpritesheet(data);
  }
  return {};
}